

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-detection.c
# Opt level: O2

void coda_detection_rule_delete(coda_detection_rule *detection_rule)

{
  coda_detection_rule_entry *entry;
  int i;
  long lVar1;
  
  if (detection_rule->entry != (coda_detection_rule_entry **)0x0) {
    for (lVar1 = 0; lVar1 < detection_rule->num_entries; lVar1 = lVar1 + 1) {
      entry = detection_rule->entry[lVar1];
      if (entry != (coda_detection_rule_entry *)0x0) {
        coda_detection_rule_entry_delete(entry);
      }
    }
    free(detection_rule->entry);
  }
  free(detection_rule);
  return;
}

Assistant:

void coda_detection_rule_delete(coda_detection_rule *detection_rule)
{
    if (detection_rule->entry != NULL)
    {
        int i;

        for (i = 0; i < detection_rule->num_entries; i++)
        {
            if (detection_rule->entry[i] != NULL)
            {
                coda_detection_rule_entry_delete(detection_rule->entry[i]);
            }
        }
        free(detection_rule->entry);
    }
    free(detection_rule);
}